

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilesBoard.cpp
# Opt level: O2

void __thiscall TilesBoard::deleteTiles(TilesBoard *this)

{
  pointer ppQVar1;
  long *plVar2;
  
  std::
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  ::clear(&this->tiles);
  while( true ) {
    plVar2 = (long *)(**(code **)(*(long *)this->verticalLayout + 0xb0))(this->verticalLayout,0);
    if (plVar2 == (long *)0x0) break;
    QLayout::removeItem((QLayoutItem *)this->verticalLayout);
    (**(code **)(*plVar2 + 8))(plVar2);
  }
  ppQVar1 = (this->horizontalLayouts).
            super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->horizontalLayouts).super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppQVar1) {
    (this->horizontalLayouts).super__Vector_base<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppQVar1;
  }
  return;
}

Assistant:

void TilesBoard::deleteTiles()
{
    tiles.clear();

    QLayoutItem* item;
    while (( item = verticalLayout->takeAt( 0 )))
    {
        verticalLayout->removeItem( 0 );
        delete item;
    }
    horizontalLayouts.clear();
}